

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::GetFileDefaultImmutableClassName_abi_cxx11_
          (string *__return_storage_ptr__,ClassNameResolver *this,FileDescriptor *file)

{
  string *psVar1;
  string local_98;
  string local_78 [48];
  long local_48;
  size_type last_slash;
  string basename;
  FileDescriptor *file_local;
  ClassNameResolver *this_local;
  
  basename.field_2._8_8_ = file;
  std::__cxx11::string::string((string *)&last_slash);
  psVar1 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)basename.field_2._8_8_);
  local_48 = std::__cxx11::string::find_last_of((char)psVar1,0x2f);
  if (local_48 == -1) {
    psVar1 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)basename.field_2._8_8_);
    std::__cxx11::string::operator=((string *)&last_slash,(string *)psVar1);
  }
  else {
    psVar1 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)basename.field_2._8_8_);
    std::__cxx11::string::substr((ulong)local_78,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)&last_slash,local_78);
    std::__cxx11::string::~string(local_78);
  }
  StripProto(&local_98,(string *)&last_slash);
  UnderscoresToCamelCase(__return_storage_ptr__,&local_98,true);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&last_slash);
  return __return_storage_ptr__;
}

Assistant:

string ClassNameResolver::GetFileDefaultImmutableClassName(
    const FileDescriptor* file) {
  string basename;
  string::size_type last_slash = file->name().find_last_of('/');
  if (last_slash == string::npos) {
    basename = file->name();
  } else {
    basename = file->name().substr(last_slash + 1);
  }
  return UnderscoresToCamelCase(StripProto(basename), true);
}